

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_paeth_predictor_16x64_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  long in_RCX;
  __m256i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  __m128i row;
  __m256i l16;
  int i;
  __m256i rep;
  __m256i l;
  int j;
  __m256i top;
  __m256i one;
  __m256i tl16;
  undefined8 local_2f0;
  undefined8 uStackY_2e8;
  int local_2a4;
  __m256i *topleft;
  __m256i *top_00;
  __m256i *left_00;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  int local_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  long local_1e0;
  uint8_t *local_1d0;
  uint8_t *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  __m256i *local_1a0;
  __m256i *palStack_198;
  __m256i *palStack_190;
  undefined8 uStack_188;
  undefined2 local_166;
  undefined2 local_164;
  ushort local_162;
  __m256i *local_160;
  __m256i *palStack_158;
  __m256i *palStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  uint8_t *local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [32];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  undefined1 local_80 [32];
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined2 local_48;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  undefined2 local_40;
  undefined2 local_3e;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  local_162 = (ushort)*(byte *)((long)in_RDX[-1] + 0x1f);
  auVar3 = vpinsrw_avx(ZEXT216(local_162),(uint)local_162,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,6);
  local_100 = vpinsrw_avx(auVar3,(uint)local_162,7);
  auVar3 = vpinsrw_avx(ZEXT216(local_162),(uint)local_162,1);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,2);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,3);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,4);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,5);
  auVar3 = vpinsrw_avx(auVar3,(uint)local_162,6);
  auStack_f0 = vpinsrw_avx(auVar3,(uint)local_162,7);
  local_200 = local_100._0_8_;
  uStack_1f8 = local_100._8_8_;
  uStack_1f0 = auStack_f0._0_8_;
  uStack_1e8 = auStack_f0._8_8_;
  local_164 = 1;
  local_82 = 1;
  local_84 = 1;
  local_86 = 1;
  local_88 = 1;
  local_8a = 1;
  local_8c = 1;
  local_8e = 1;
  local_90 = 1;
  local_92 = 1;
  local_94 = 1;
  local_96 = 1;
  local_98 = 1;
  local_9a = 1;
  local_9c = 1;
  local_9e = 1;
  local_a0 = 1;
  auVar3 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar3 = vpinsrw_avx(auVar3,1,2);
  auVar3 = vpinsrw_avx(auVar3,1,3);
  auVar3 = vpinsrw_avx(auVar3,1,4);
  auVar3 = vpinsrw_avx(auVar3,1,5);
  auVar3 = vpinsrw_avx(auVar3,1,6);
  auVar3 = vpinsrw_avx(auVar3,1,7);
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  local_220._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar1;
  local_220._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar6 = ZEXT3264(local_220);
  local_1e0 = in_RCX;
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  local_e0 = local_162;
  local_de = local_162;
  local_dc = local_162;
  local_da = local_162;
  local_d8 = local_162;
  local_d6 = local_162;
  local_d4 = local_162;
  local_d2 = local_162;
  local_d0 = local_162;
  local_ce = local_162;
  local_cc = local_162;
  local_ca = local_162;
  local_c8 = local_162;
  local_c6 = local_162;
  local_c4 = local_162;
  local_c2 = local_162;
  local_c0 = local_220;
  get_top_vector(in_RDX,in_RSI);
  local_240 = auVar6._0_32_;
  for (local_244 = 0; auVar4 = auVar6._0_32_, local_244 < 4; local_244 = local_244 + 1) {
    get_left_vector((__m256i *)(local_1e0 + (local_244 << 4)),in_RSI);
    local_166 = 0x8000;
    local_32 = 0x8000;
    local_34 = 0x8000;
    local_36 = 0x8000;
    local_38 = 0x8000;
    local_3a = 0x8000;
    local_3c = 0x8000;
    local_3e = 0x8000;
    local_40 = 0x8000;
    local_42 = 0x8000;
    local_44 = 0x8000;
    local_46 = 0x8000;
    local_48 = 0x8000;
    local_4a = 0x8000;
    local_4c = 0x8000;
    local_4e = 0x8000;
    local_50 = 0x8000;
    auVar3 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar3 = vpinsrw_avx(auVar3,0x8000,2);
    auVar3 = vpinsrw_avx(auVar3,0x8000,3);
    auVar3 = vpinsrw_avx(auVar3,0x8000,4);
    auVar3 = vpinsrw_avx(auVar3,0x8000,5);
    auVar3 = vpinsrw_avx(auVar3,0x8000,6);
    auVar3 = vpinsrw_avx(auVar3,0x8000,7);
    auVar1 = vpinsrw_avx(ZEXT216(0x8000),0x8000,1);
    auVar1 = vpinsrw_avx(auVar1,0x8000,2);
    auVar1 = vpinsrw_avx(auVar1,0x8000,3);
    auVar1 = vpinsrw_avx(auVar1,0x8000,4);
    auVar1 = vpinsrw_avx(auVar1,0x8000,5);
    auVar1 = vpinsrw_avx(auVar1,0x8000,6);
    auVar1 = vpinsrw_avx(auVar1,0x8000,7);
    auVar5._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar1;
    auVar5._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
    local_80 = auVar5;
    for (local_2a4 = 0; auVar6 = ZEXT3264(auVar5), local_2a4 < 0x10; local_2a4 = local_2a4 + 1) {
      local_280 = auVar4._0_8_;
      uStack_278 = auVar4._8_8_;
      uStack_270 = auVar4._16_8_;
      uStack_268 = auVar4._24_8_;
      topleft = auVar5._0_8_;
      top_00 = auVar5._8_8_;
      left_00 = auVar5._16_8_;
      uStack_288 = auVar5._24_8_;
      local_140 = local_280;
      uStack_138 = uStack_278;
      uStack_130 = uStack_270;
      uStack_128 = uStack_268;
      uStack_148 = uStack_288;
      auVar2 = vpshufb_avx2(auVar4,auVar5);
      in_RSI = local_240;
      auVar3 = auVar2._0_16_;
      local_160 = topleft;
      palStack_158 = top_00;
      palStack_150 = left_00;
      paeth_16x1_pred(left_00,top_00,topleft);
      local_108 = local_1c8;
      local_2f0 = auVar3._0_8_;
      local_120 = local_2f0;
      uStackY_2e8 = auVar3._8_8_;
      uStack_118 = uStackY_2e8;
      *(undefined8 *)local_1c8 = local_2f0;
      *(undefined8 *)(local_1c8 + 8) = uStackY_2e8;
      local_1c8 = local_1d0 + (long)local_1c8;
      uStack_188 = uStack_288;
      local_1c0 = local_220._0_8_;
      uStack_1b8 = local_220._8_8_;
      uStack_1b0 = local_220._16_8_;
      uStack_1a8 = local_220._24_8_;
      auVar5 = vpaddw_avx2(auVar5,local_220);
      local_1a0 = topleft;
      palStack_198 = top_00;
      palStack_190 = left_00;
    }
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x64_avx2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  const __m256i tl16 = _mm256_set1_epi16((int16_t)above[-1]);
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i top = get_top_vector(above);

  for (int j = 0; j < 4; ++j) {
    const __m256i l = get_left_vector(left + j * 16);
    __m256i rep = _mm256_set1_epi16((short)0x8000);
    for (int i = 0; i < 16; ++i) {
      const __m256i l16 = _mm256_shuffle_epi8(l, rep);
      const __m128i row = paeth_16x1_pred(&l16, &top, &tl16);

      _mm_store_si128((__m128i *)dst, row);
      dst += stride;
      rep = _mm256_add_epi16(rep, one);
    }
  }
}